

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::PrecisionFormatCase::test(PrecisionFormatCase *this)

{
  ostringstream *poVar1;
  int iVar2;
  undefined8 uVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  StateQueryMemoryWriteGuard<int> precision;
  StateQueryMemoryWriteGuard<int[2]> range;
  undefined1 local_1a8 [384];
  
  lVar5 = (long)(int)(this->m_precisionType - 0x8df0) * 0xc;
  uVar3 = *(undefined8 *)(&DAT_01867a60 + lVar5);
  iVar2 = *(int *)(&DAT_01867a68 + lVar5);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::StateQueryMemoryWriteGuard(&range);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard(&precision)
  ;
  glu::CallLogWrapper::glGetShaderPrecisionFormat
            (&(this->super_ApiCase).super_CallLogWrapper,this->m_shaderType,this->m_precisionType,
             range.m_value,&precision.m_value);
  ApiCase::expectError(&this->super_ApiCase,0);
  bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::verifyValidity
                    (&range,(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                            m_testCtx);
  if (!bVar4) {
    return;
  }
  bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&precision,
                     (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  if (!bVar4) {
    return;
  }
  local_1a8._0_8_ = (this->super_ApiCase).m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"range[0] = ");
  std::ostream::operator<<(poVar1,range.m_value[0]);
  std::operator<<((ostream *)poVar1,"\n");
  std::operator<<((ostream *)poVar1,"range[1] = ");
  std::ostream::operator<<(poVar1,range.m_value[1]);
  std::operator<<((ostream *)poVar1,"\n");
  std::operator<<((ostream *)poVar1,"precision = ");
  std::ostream::operator<<(poVar1,precision.m_value);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  iVar6 = (int)uVar3;
  iVar7 = (int)((ulong)uVar3 >> 0x20);
  if (this->m_precisionType == 0x8df2) {
    if (((range.m_value[0] == iVar6) && (range.m_value[1] == iVar7)) && (precision.m_value == iVar2)
       ) {
      return;
    }
    local_1a8._0_8_ = (this->super_ApiCase).m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"// ERROR: Invalid precision format, expected:\n");
    std::operator<<((ostream *)poVar1,"\trange[0] = ");
    std::ostream::operator<<(poVar1,iVar6);
    std::operator<<((ostream *)poVar1,"\n");
    std::operator<<((ostream *)poVar1,"\trange[1] = ");
    std::ostream::operator<<(poVar1,iVar7);
    std::operator<<((ostream *)poVar1,"\n");
    std::operator<<((ostream *)poVar1,"\tprecision = ");
    std::ostream::operator<<(poVar1,iVar2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (range.m_value[0] < iVar6) {
      local_1a8._0_8_ = (this->super_ApiCase).m_log;
      poVar1 = (ostringstream *)(local_1a8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"// ERROR: Invalid range[0], expected greater or equal to ")
      ;
      std::ostream::operator<<(poVar1,iVar6);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    if (range.m_value[1] < iVar7) {
      local_1a8._0_8_ = (this->super_ApiCase).m_log;
      poVar1 = (ostringstream *)(local_1a8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"// ERROR: Invalid range[1], expected greater or equal to ")
      ;
      std::ostream::operator<<(poVar1,iVar7);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      if (iVar2 <= precision.m_value) goto LAB_010e071b;
    }
    else if (iVar2 <= precision.m_value) {
      if (iVar6 <= range.m_value[0]) {
        return;
      }
      goto LAB_010e071b;
    }
    local_1a8._0_8_ = (this->super_ApiCase).m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"// ERROR: Invalid precision, expected greater or equal to ");
    std::ostream::operator<<(poVar1,iVar2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
LAB_010e071b:
  tcu::TestContext::setTestResult
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_FAIL,"Got invalid precision/range");
  return;
}

Assistant:

void test (void)
	{
		const RequiredFormat											expected = getRequiredFormat();
		bool															error = false;
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLboolean>	shaderCompiler;
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint[2]>	range;
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint>		precision;

		// query values
		glGetShaderPrecisionFormat(m_shaderType, m_precisionType, range, &precision);
		expectError(GL_NO_ERROR);

		if (!range.verifyValidity(m_testCtx))
			return;
		if (!precision.verifyValidity(m_testCtx))
			return;

		m_log
			<< tcu::TestLog::Message
			<< "range[0] = " << range[0] << "\n"
			<< "range[1] = " << range[1] << "\n"
			<< "precision = " << precision
			<< tcu::TestLog::EndMessage;

		// verify values

		if (m_precisionType == GL_HIGH_FLOAT)
		{
			// highp float must be IEEE 754 single

			if (range[0] != expected.negativeRange ||
				range[1] != expected.positiveRange ||
				precision != expected.precision)
			{
				m_log
					<< tcu::TestLog::Message
					<< "// ERROR: Invalid precision format, expected:\n"
					<< "\trange[0] = " << expected.negativeRange << "\n"
					<< "\trange[1] = " << expected.positiveRange << "\n"
					<< "\tprecision = " << expected.precision
					<< tcu::TestLog::EndMessage;
				error = true;
			}
		}
		else
		{
			if (range[0] < expected.negativeRange)
			{
				m_log << tcu::TestLog::Message << "// ERROR: Invalid range[0], expected greater or equal to " << expected.negativeRange << tcu::TestLog::EndMessage;
				error = true;
			}

			if (range[1] < expected.positiveRange)
			{
				m_log << tcu::TestLog::Message << "// ERROR: Invalid range[1], expected greater or equal to " << expected.positiveRange << tcu::TestLog::EndMessage;
				error = true;
			}

			if (precision < expected.precision)
			{
				m_log << tcu::TestLog::Message << "// ERROR: Invalid precision, expected greater or equal to " << expected.precision << tcu::TestLog::EndMessage;
				error = true;
			}
		}

		if (error)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid precision/range");
	}